

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall BadDataException::~BadDataException(BadDataException *this)

{
  *(undefined ***)this = &PTR__BadDataException_0019dd78;
  std::__cxx11::string::~string((string *)&this->m_errorString);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

BadDataException(const std::string& message)
        : m_errorString(message)
    {}